

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O1

void RC4_set_key(RC4_KEY *key,int len,uchar *data)

{
  uint uVar1;
  uint i;
  long lVar2;
  uint i_1;
  ulong uVar3;
  uint uVar4;
  
  key->x = 0;
  key->y = 0;
  lVar2 = 0;
  do {
    key->data[lVar2] = (uint)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  lVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  do {
    uVar1 = key->data[lVar2];
    uVar3 = (ulong)(byte)((char)uVar3 + (char)uVar1 + data[uVar4]);
    uVar4 = uVar4 + 1;
    if (uVar4 == len) {
      uVar4 = 0;
    }
    key->data[lVar2] = key->data[uVar3];
    key->data[uVar3] = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

void RC4_set_key(RC4_KEY *rc4key, unsigned len, const uint8_t *key) {
  uint32_t *d = &rc4key->data[0];
  rc4key->x = 0;
  rc4key->y = 0;

  for (unsigned i = 0; i < 256; i++) {
    d[i] = i;
  }

  unsigned id1 = 0, id2 = 0;
  for (unsigned i = 0; i < 256; i++) {
    uint32_t tmp = d[i];
    id2 = (key[id1] + tmp + id2) & 0xff;
    if (++id1 == len) {
      id1 = 0;
    }
    d[i] = d[id2];
    d[id2] = tmp;
  }
}